

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O0

double Alg::min_vector_nonzero_mask
                 (vector<double,_std::allocator<double>_> *budget_list,
                 vector<bool,_std::allocator<bool>_> *mask)

{
  const_reference cVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined8 local_30;
  size_t i;
  double esp;
  double tmp;
  vector<bool,_std::allocator<bool>_> *mask_local;
  vector<double,_std::allocator<double>_> *budget_list_local;
  
  esp = 4294967295.0;
  local_30 = 0;
  while( true ) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(budget_list);
    if (sVar2 <= local_30) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,local_30);
    if (*pvVar3 < esp) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,local_30);
      if (0.0001 < ABS(*pvVar3)) {
        cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,local_30);
        if (!cVar1) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,local_30);
          esp = *pvVar3;
        }
      }
    }
    local_30 = local_30 + 1;
  }
  return esp;
}

Assistant:

double Alg::min_vector_nonzero_mask(const std::vector<double> & budget_list, const std::vector<bool> & mask) {
    double tmp = WINT_MAX;
    const double esp = 0.0001;
    for (size_t i = 0; i < budget_list.size(); i++) {
        if (budget_list[i] < tmp && fabs(budget_list[i]) > esp && mask[i] == false) {
            tmp = budget_list[i];
        }
    }
    return tmp;
}